

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_device(nng_socket s1,nng_socket s2)

{
  nng_err nVar1;
  undefined1 local_1e8 [8];
  nni_aio aio;
  
  nni_aio_init((nni_aio *)local_1e8,(nni_cb)0x0,(void *)0x0);
  nng_device_aio((nni_aio *)local_1e8,s1,s2);
  nni_aio_wait((nni_aio *)local_1e8);
  nVar1 = nni_aio_result((nni_aio *)local_1e8);
  nni_aio_fini((nni_aio *)local_1e8);
  return nVar1;
}

Assistant:

int
nng_device(nng_socket s1, nng_socket s2)
{
	nni_aio aio;
	int     rv;
	nni_aio_init(&aio, NULL, NULL);
	nng_device_aio(&aio, s1, s2);
	nni_aio_wait(&aio);
	rv = nni_aio_result(&aio);
	nni_aio_fini(&aio);
	return (rv);
}